

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.h
# Opt level: O0

void __thiscall
event_track::EventMessageInstanceBox::EventMessageInstanceBox(EventMessageInstanceBox *this)

{
  EventMessageInstanceBox *this_local;
  
  fmp4_stream::full_box::full_box(&this->super_full_box);
  (this->super_full_box).super_box._vptr_box = (_func_int **)&PTR_size_00139d40;
  *(undefined4 *)&(this->super_full_box).field_0x6c = 0;
  this->presentation_time_delta_ = 0;
  this->event_duration_ = 0;
  this->id_ = 0;
  std::__cxx11::string::string((string *)&this->scheme_id_uri_);
  std::__cxx11::string::string((string *)&this->value_);
  memset(&this->message_data_,0,0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->message_data_);
  return;
}

Assistant:

EventMessageInstanceBox()
			: reserved_(0), event_duration_(0), \
			id_(0), scheme_id_uri_(), \
			value_(), message_data_(), presentation_time_delta_(0)
		{
		}